

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_test.cc
# Opt level: O3

void TestCipher(EVP_CIPHER *cipher,Operation input_op,bool padding,Span<const_unsigned_char> key,
               Span<const_unsigned_char> iv,Span<const_unsigned_char> plaintext,
               Span<const_unsigned_char> ciphertext,Span<const_unsigned_char> aad,
               Span<const_unsigned_char> tag)

{
  Span<const_unsigned_char> key_00;
  Span<const_unsigned_char> key_01;
  Span<const_unsigned_char> iv_00;
  Span<const_unsigned_char> iv_01;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  AssertHelperData *pAVar8;
  undefined7 in_register_00000011;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  AssertHelperData *pAVar11;
  uchar *puVar12;
  uint *puVar13;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar14;
  pointer pcVar15;
  _Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var16;
  AssertHelperData *pAVar17;
  bool bVar18;
  ScopedTrace gtest_trace_403;
  bool in_place;
  ScopedTrace gtest_trace_397;
  ScopedTrace gtest_trace_392;
  ScopedTrace gtest_trace_405;
  uint8_t ecount_buf [16];
  bool copy;
  size_t chunk_size;
  uint num;
  int num_1;
  vector<Operation,_std::allocator<Operation>_> ops;
  AES_KEY aes;
  ScopedTrace local_25c;
  bool local_25b;
  ScopedTrace local_25a;
  ScopedTrace local_259;
  AssertHelper local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_250;
  AssertHelper local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  undefined1 local_238 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_230;
  pointer local_228;
  undefined1 local_218 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  AssertHelperData *local_200;
  uchar *local_1f8;
  AssertHelperData *local_1f0;
  undefined4 local_1e8;
  char local_1e2 [2];
  _Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  Bytes local_1d8;
  AssertHelperData *local_1c8;
  uint local_1bc;
  int local_1b8;
  uint local_1b4;
  uchar *local_1b0;
  ulong local_1a8;
  AssertHelperData *local_1a0;
  AssertHelperData *local_198;
  size_t local_190;
  EVP_CIPHER *local_188;
  Operation local_17c;
  Bytes local_178;
  uint *local_168;
  uint *puStack_160;
  long local_158;
  uint *local_150;
  uint *local_148;
  long local_140;
  long local_138;
  ulong local_130;
  undefined1 local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  
  local_190 = key.size_;
  local_1b0 = key.data_;
  local_1e8 = (undefined4)CONCAT71(in_register_00000011,padding);
  local_188 = (EVP_CIPHER *)cipher;
  uVar4 = EVP_CIPHER_block_size((EVP_CIPHER *)cipher);
  local_168 = (uint *)0x0;
  puStack_160 = (uint *)0x0;
  local_158 = 0;
  if (input_op == kBoth) {
    local_128._0_4_ = 1;
    local_128._4_4_ = 2;
    std::vector<Operation,std::allocator<Operation>>::_M_assign_aux<Operation_const*>
              ((vector<Operation,std::allocator<Operation>> *)&local_168,local_128);
  }
  else {
    local_128._0_4_ = input_op;
    std::vector<Operation,std::allocator<Operation>>::_M_assign_aux<Operation_const*>
              ((vector<Operation,std::allocator<Operation>> *)&local_168,local_128);
  }
  local_150 = puStack_160;
  if (local_168 != puStack_160) {
    local_130 = (ulong)uVar4;
    local_1b8 = (int)local_190 * 8;
    puVar13 = local_168;
    do {
      uVar4 = *puVar13;
      uVar9 = (ulong)uVar4;
      local_148 = puVar13;
      if (3 < uVar9) {
LAB_00240ea7:
        abort();
      }
      testing::ScopedTrace::ScopedTrace
                (&local_259,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x188,&DAT_00523d50 + *(int *)(&DAT_00523d50 + uVar9 * 4));
      local_1bc = (uint)(uVar4 == 1);
      lVar7 = 0;
      local_1a8 = uVar9;
      do {
        local_1c8 = *(AssertHelperData **)((long)TestCipher::kChunkSizes + lVar7);
        local_140 = lVar7;
        testing::ScopedTrace::ScopedTrace<unsigned_long>
                  (&local_25a,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0x18d,(unsigned_long *)&local_1c8);
        if (((local_1c8 <= plaintext.size_) || (local_1c8 <= ciphertext.size_)) ||
           (local_1c8 <= aad.size_)) {
          local_1e2[0] = '\0';
          local_1e2[1] = '\x01';
          lVar7 = 0;
          do {
            local_25b = (bool)local_1e2[lVar7];
            testing::ScopedTrace::ScopedTrace<bool>
                      (&local_25c,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0x193,&local_25b);
            local_138 = lVar7;
            local_128._0_2_ = 0x100;
            local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        iv.data_;
            local_198 = (AssertHelperData *)iv.size_;
            lVar7 = 0;
            do {
              while( true ) {
                local_238[0] = (internal)local_128[lVar7];
                testing::ScopedTrace::ScopedTrace<bool>
                          ((ScopedTrace *)&local_258,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                           ,0x195,(bool *)local_238);
                pAVar8 = local_198;
                key_00.size_ = local_190;
                key_00.data_ = local_1b0;
                iv_00.size_ = (size_t)local_198;
                iv_00.data_ = (uchar *)local_208;
                TestCipherAPI((EVP_CIPHER *)local_188,(Operation)local_1a8,(bool)(char)local_1e8,
                              (bool)local_238[0],local_25b,false,(size_t)local_1c8,key_00,iv_00,
                              plaintext,ciphertext,aad,tag);
                if ((char)local_1e8 == '\0') break;
                testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_258);
                lVar7 = lVar7 + 1;
                if (lVar7 == 2) goto LAB_002404ba;
              }
              if ((ulong)local_1c8 % local_130 == 0) {
                key_01.size_ = local_190;
                key_01.data_ = local_1b0;
                iv_01.size_ = (size_t)pAVar8;
                iv_01.data_ = (uchar *)local_208;
                TestCipherAPI((EVP_CIPHER *)local_188,(Operation)local_1a8,false,(bool)local_238[0],
                              local_25b,true,(size_t)local_1c8,key_01,iv_01,plaintext,ciphertext,aad
                              ,tag);
              }
              testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_258);
              bVar18 = local_25b;
              lVar7 = lVar7 + 1;
            } while (lVar7 != 2);
            if ((char)local_1e8 == '\0') {
              local_17c = (Operation)local_1a8;
              local_1f0 = local_1c8;
              pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        plaintext.size_;
              local_200 = (AssertHelperData *)ciphertext.size_;
              local_1f8 = ciphertext.data_;
              local_1a0 = (AssertHelperData *)plaintext.data_;
              if (local_17c == kEncrypt) {
                pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ciphertext.size_;
                local_200 = (AssertHelperData *)plaintext.size_;
                local_1f8 = plaintext.data_;
                local_1a0 = (AssertHelperData *)ciphertext.data_;
              }
              iVar5 = EVP_CIPHER_nid(local_188);
              if ((iVar5 - 0x1a4U < 9) &&
                 (bVar1 = true, (0x111U >> (iVar5 - 0x1a4U & 0x1f) & 1) != 0)) {
LAB_00240373:
                if ((8 < iVar5 - 0x1a3U) || ((0x111U >> (iVar5 - 0x1a3U & 0x1f) & 1) == 0)) {
                  if (!bVar1) goto LAB_002404ba;
                  bVar1 = true;
                }
                bVar3 = false;
                bVar2 = bVar1;
              }
              else {
                bVar3 = true;
                bVar1 = false;
                bVar2 = false;
                if (2 < iVar5 - 0x388U) goto LAB_00240373;
              }
              local_238._0_4_ = 3;
              testing::internal::CmpHelperNE<Operation,Operation>
                        ((internal *)local_128,"op","Operation::kInvalidDecrypt",&local_17c,
                         (Operation *)local_238);
              if (local_128[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_238);
                pcVar15 = "";
                if (local_120 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar15 = (local_120->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_258,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                           ,0x134,pcVar15);
                testing::internal::AssertHelper::operator=(&local_258,(Message *)local_238);
                testing::internal::AssertHelper::~AssertHelper(&local_258);
                if (local_238 != (undefined1  [8])0x0) {
                  (**(code **)(*(long *)local_238 + 8))();
                }
                if (local_120 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                goto LAB_002404ba;
                pdVar14 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_120;
                pbVar10 = local_120;
              }
              else {
                if (local_120 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_120,local_120);
                }
                if ((((int)local_1a8 == 1) || (8 < iVar5 - 0x1a3U)) ||
                   ((0x111U >> (iVar5 - 0x1a3U & 0x1f) & 1) == 0)) {
                  local_258.data_._0_4_ = 0;
                  iVar6 = AES_set_encrypt_key(local_1b0,local_1b8,(AES_KEY *)local_128);
                  local_248.data_._0_4_ = iVar6;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)local_238,"0",
                             "AES_set_encrypt_key(key.data(), key.size() * 8, &aes)",
                             (int *)&local_258,(int *)&local_248);
                  if (local_238[0] != (internal)0x0) goto LAB_00240604;
                  testing::Message::Message((Message *)&local_258);
                  pcVar15 = "";
                  if (pbStack_230 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar15 = (pbStack_230->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_248,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                             ,0x138,pcVar15);
                  testing::internal::AssertHelper::operator=(&local_248,(Message *)&local_258);
                }
                else {
                  local_258.data_._0_4_ = 0;
                  iVar6 = AES_set_decrypt_key(local_1b0,local_1b8,(AES_KEY *)local_128);
                  local_248.data_._0_4_ = iVar6;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)local_238,"0",
                             "AES_set_decrypt_key(key.data(), key.size() * 8, &aes)",
                             (int *)&local_258,(int *)&local_248);
                  if (local_238[0] != (internal)0x0) {
LAB_00240604:
                    if (pbStack_230 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&pbStack_230,pbStack_230);
                    }
                    pAVar8 = local_200;
                    local_238 = (undefined1  [8])0x0;
                    pbStack_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0;
                    local_228 = (pointer)0x0;
                    if (bVar18 == false) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238,
                                 (size_type)pbVar10);
                      local_248.data_ = local_200;
                    }
                    else {
                      std::vector<unsigned_char,std::allocator<unsigned_char>>::
                      _M_assign_aux<unsigned_char_const*>
                                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_238,
                                 local_1f8,local_1f8 + (long)local_200);
                      local_248.data_ = pAVar8;
                    }
                    local_1e0.
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          )(_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            )local_238;
                    pAVar8 = (AssertHelperData *)((long)pbStack_230 - (long)local_238);
                    local_218 = (undefined1  [8])pAVar8;
                    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                              ((internal *)&local_258,"in.size()","out.size()",
                               (unsigned_long *)&local_248,(unsigned_long *)local_218);
                    if (local_258.data_._0_1_ == (ScopedTrace)0x0) {
                      testing::Message::Message((Message *)&local_248);
                      pcVar15 = "";
                      if (local_250 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar15 = (local_250->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)local_218,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                                 ,0x145,pcVar15);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)local_218,(Message *)&local_248);
LAB_00240950:
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_218);
                      if (local_248.data_ != (AssertHelperData *)0x0) {
                        (**(code **)(*(long *)local_248.data_ + 8))();
                      }
                      if (local_250 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pdVar14 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&local_250;
                        pbVar10 = local_250;
LAB_0024097a:
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()(pdVar14,pbVar10);
                      }
                    }
                    else {
                      if (local_250 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_250,local_250);
                      }
                      local_248.data_ = local_198;
                      local_218 = (undefined1  [8])&DAT_00000010;
                      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                                ((internal *)&local_258,"iv.size()","size_t{16}",
                                 (unsigned_long *)&local_248,(unsigned_long *)local_218);
                      if (local_258.data_._0_1_ == (ScopedTrace)0x0) {
                        testing::Message::Message((Message *)&local_248);
                        pcVar15 = "";
                        if (local_250 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar15 = (local_250->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)local_218,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                                   ,0x148,pcVar15);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)local_218,(Message *)&local_248);
                        goto LAB_00240950;
                      }
                      if (local_250 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_250,local_250);
                      }
                      if (local_198 != (AssertHelperData *)0x0) {
                        memcpy(&local_258,local_208,(size_t)local_198);
                      }
                      if (bVar3) {
                        local_1b4 = 0;
                        puVar12 = local_1f8;
                        _Var16.
                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl =
                             (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              )(_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                )local_1e0;
                        pAVar17 = local_200;
                        local_208 = pbVar10;
                        if (local_1f0 == (AssertHelperData *)0x0) {
                          AES_ctr128_encrypt(local_1f8,
                                             (uchar *)local_1e0.
                                                                                                            
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,(size_t)local_200,
                                             (AES_KEY *)local_128,(uchar *)&local_258,
                                             (uchar *)&local_248,&local_1b4);
                        }
                        else {
                          do {
                            pAVar11 = local_1f0;
                            if (pAVar17 < local_1f0) {
                              pAVar11 = pAVar17;
                            }
                            AES_ctr128_encrypt(puVar12,(uchar *)_Var16.
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,(size_t)pAVar11,(AES_KEY *)local_128
                                               ,(uchar *)&local_258,(uchar *)&local_248,&local_1b4);
                            bVar18 = pAVar8 < pAVar11;
                            pAVar8 = (AssertHelperData *)((long)pAVar8 - (long)pAVar11);
                            if (bVar18) goto LAB_00240ea7;
                            pAVar17 = (AssertHelperData *)((long)pAVar17 - (long)pAVar11);
                            puVar12 = puVar12 + (long)pAVar11;
                            _Var16.
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl =
                                 (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  )(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&pAVar11->type +
                                      (long)&((AssertHelperData *)
                                             _Var16.
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl)->type);
                          } while (pAVar17 != (AssertHelperData *)0x0);
                        }
                        local_1d8.span_.data_ = (uchar *)local_1a0;
                        local_1d8.span_.size_ = (size_t)local_208;
                        local_178.span_.size_ = (long)pbStack_230 - (long)local_238;
                        local_178.span_.data_ = (uchar *)local_238;
                        testing::internal::CmpHelperEQ<Bytes,Bytes>
                                  ((internal *)local_218,"Bytes(expected)","Bytes(result)",
                                   &local_1d8,&local_178);
                        if (local_218[0] == (internal)0x0) {
                          testing::Message::Message((Message *)&local_1d8);
                          pcVar15 = "";
                          if (local_210 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar15 = (local_210->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&local_178,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                                     ,0x15b,pcVar15);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&local_178,(Message *)&local_1d8);
                          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178)
                          ;
                          if ((AssertHelperData *)local_1d8.span_.data_ != (AssertHelperData *)0x0)
                          {
                            (**(code **)(*(long *)local_1d8.span_.data_ + 8))();
                          }
                        }
                        if (local_210 ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) goto LAB_0024097f;
                        pdVar14 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&local_210;
                        pbVar10 = local_210;
                        goto LAB_0024097a;
                      }
                      if (((iVar5 - 0x1a3U < 9) && ((0x111U >> (iVar5 - 0x1a3U & 0x1f) & 1) != 0))
                         && (((ulong)local_1f0 & 0xf) == 0)) {
                        puVar12 = local_1f8;
                        _Var16.
                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl =
                             (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              )(_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                )local_1e0;
                        pAVar17 = local_200;
                        local_208 = pbVar10;
                        if (local_1f0 == (AssertHelperData *)0x0) {
                          AES_cbc_encrypt(local_1f8,
                                          (uchar *)local_1e0.
                                                                                                      
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,(size_t)local_200,
                                          (AES_KEY *)local_128,(uchar *)&local_258,local_1bc);
                        }
                        else {
                          do {
                            pAVar11 = local_1f0;
                            if (pAVar17 < local_1f0) {
                              pAVar11 = pAVar17;
                            }
                            AES_cbc_encrypt(puVar12,(uchar *)_Var16.
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,(size_t)pAVar11,(AES_KEY *)local_128
                                            ,(uchar *)&local_258,local_1bc);
                            bVar18 = pAVar8 < pAVar11;
                            pAVar8 = (AssertHelperData *)((long)pAVar8 - (long)pAVar11);
                            if (bVar18) goto LAB_00240ea7;
                            pAVar17 = (AssertHelperData *)((long)pAVar17 - (long)pAVar11);
                            puVar12 = puVar12 + (long)pAVar11;
                            _Var16.
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl =
                                 (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  )(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&pAVar11->type +
                                      (long)&((AssertHelperData *)
                                             _Var16.
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl)->type);
                          } while (pAVar17 != (AssertHelperData *)0x0);
                        }
                        local_218 = (undefined1  [8])local_1a0;
                        local_210 = local_208;
                        local_1d8.span_.size_ = (long)pbStack_230 - (long)local_238;
                        local_1d8.span_.data_ = (uchar *)local_238;
                        testing::internal::CmpHelperEQ<Bytes,Bytes>
                                  ((internal *)&local_248,"Bytes(expected)","Bytes(result)",
                                   (Bytes *)local_218,&local_1d8);
                        if (local_248.data_._0_1_ == (internal)0x0) {
                          testing::Message::Message((Message *)local_218);
                          pcVar15 = "";
                          if (local_240 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar15 = (local_240->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&local_1d8,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                                     ,0x168,pcVar15);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&local_1d8,(Message *)local_218);
LAB_00240e1b:
                          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8)
                          ;
                          if (local_218 != (undefined1  [8])0x0) {
                            (**(code **)(*(long *)local_218 + 8))();
                          }
                        }
                      }
                      else {
                        if (!bVar2) goto LAB_0024097f;
                        local_178.span_.data_ =
                             (uchar *)((ulong)local_178.span_.data_ & 0xffffffff00000000);
                        puVar12 = local_1f8;
                        _Var16.
                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl =
                             (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              )(_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                )local_1e0;
                        pAVar17 = local_200;
                        local_208 = pbVar10;
                        if (local_1f0 == (AssertHelperData *)0x0) {
                          AES_ofb128_encrypt(local_1f8,
                                             (uchar *)local_1e0.
                                                                                                            
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,(size_t)local_200,
                                             (AES_KEY *)local_128,(uchar *)&local_258,
                                             (int *)&local_178);
                        }
                        else {
                          do {
                            pAVar11 = local_1f0;
                            if (pAVar17 < local_1f0) {
                              pAVar11 = pAVar17;
                            }
                            AES_ofb128_encrypt(puVar12,(uchar *)_Var16.
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,(size_t)pAVar11,(AES_KEY *)local_128
                                               ,(uchar *)&local_258,(int *)&local_178);
                            bVar18 = pAVar8 < pAVar11;
                            pAVar8 = (AssertHelperData *)((long)pAVar8 - (long)pAVar11);
                            if (bVar18) goto LAB_00240ea7;
                            pAVar17 = (AssertHelperData *)((long)pAVar17 - (long)pAVar11);
                            puVar12 = puVar12 + (long)pAVar11;
                            _Var16.
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl =
                                 (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  )(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&pAVar11->type +
                                      (long)&((AssertHelperData *)
                                             _Var16.
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl)->type);
                          } while (pAVar17 != (AssertHelperData *)0x0);
                        }
                        local_218 = (undefined1  [8])local_1a0;
                        local_210 = local_208;
                        local_1d8.span_.size_ = (long)pbStack_230 - (long)local_238;
                        local_1d8.span_.data_ = (uchar *)local_238;
                        testing::internal::CmpHelperEQ<Bytes,Bytes>
                                  ((internal *)&local_248,"Bytes(expected)","Bytes(result)",
                                   (Bytes *)local_218,&local_1d8);
                        if (local_248.data_._0_1_ == (internal)0x0) {
                          testing::Message::Message((Message *)local_218);
                          pcVar15 = "";
                          if (local_240 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar15 = (local_240->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&local_1d8,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                                     ,0x175,pcVar15);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&local_1d8,(Message *)local_218);
                          goto LAB_00240e1b;
                        }
                      }
                      if (local_240 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pdVar14 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&local_240;
                        pbVar10 = local_240;
                        goto LAB_0024097a;
                      }
                    }
LAB_0024097f:
                    if (local_238 != (undefined1  [8])0x0) {
                      operator_delete((void *)local_238,(long)local_228 - (long)local_238);
                    }
                    goto LAB_002404ba;
                  }
                  testing::Message::Message((Message *)&local_258);
                  pcVar15 = "";
                  if (pbStack_230 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar15 = (pbStack_230->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_248,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                             ,0x13a,pcVar15);
                  testing::internal::AssertHelper::operator=(&local_248,(Message *)&local_258);
                }
                testing::internal::AssertHelper::~AssertHelper(&local_248);
                if ((long *)CONCAT44(local_258.data_._4_4_,local_258.data_._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_258.data_._4_4_,local_258.data_._0_4_) + 8))
                            ();
                }
                if (pbStack_230 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                goto LAB_002404ba;
                pdVar14 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&pbStack_230;
                pbVar10 = pbStack_230;
              }
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()(pdVar14,pbVar10);
            }
LAB_002404ba:
            testing::ScopedTrace::~ScopedTrace(&local_25c);
            lVar7 = local_138 + 1;
          } while (lVar7 != 2);
        }
        testing::ScopedTrace::~ScopedTrace(&local_25a);
        lVar7 = local_140 + 8;
      } while (lVar7 != 0x88);
      testing::ScopedTrace::~ScopedTrace(&local_259);
      puVar13 = local_148 + 1;
    } while (puVar13 != local_150);
  }
  if (local_168 != (uint *)0x0) {
    operator_delete(local_168,local_158 - (long)local_168);
  }
  return;
}

Assistant:

static void TestCipher(const EVP_CIPHER *cipher, Operation input_op,
                       bool padding, bssl::Span<const uint8_t> key,
                       bssl::Span<const uint8_t> iv,
                       bssl::Span<const uint8_t> plaintext,
                       bssl::Span<const uint8_t> ciphertext,
                       bssl::Span<const uint8_t> aad,
                       bssl::Span<const uint8_t> tag) {
  size_t block_size = EVP_CIPHER_block_size(cipher);
  std::vector<Operation> ops;
  if (input_op == Operation::kBoth) {
    ops = {Operation::kEncrypt, Operation::kDecrypt};
  } else {
    ops = {input_op};
  }
  for (Operation op : ops) {
    SCOPED_TRACE(OperationToString(op));
    // Zero indicates a single-shot API.
    static const size_t kChunkSizes[] = {0,  1,  2,  5,  7,  8,  9,  15, 16,
                                         17, 31, 32, 33, 63, 64, 65, 512};
    for (size_t chunk_size : kChunkSizes) {
      SCOPED_TRACE(chunk_size);
      if (chunk_size > plaintext.size() && chunk_size > ciphertext.size() &&
          chunk_size > aad.size()) {
        continue;
      }
      for (bool in_place : {false, true}) {
        SCOPED_TRACE(in_place);
        for (bool copy : {false, true}) {
          SCOPED_TRACE(copy);
          TestCipherAPI(cipher, op, padding, copy, in_place,
                        /*use_evp_cipher=*/false, chunk_size, key, iv,
                        plaintext, ciphertext, aad, tag);
          if (!padding && chunk_size % block_size == 0) {
            TestCipherAPI(cipher, op, padding, copy, in_place,
                          /*use_evp_cipher=*/true, chunk_size, key, iv,
                          plaintext, ciphertext, aad, tag);
          }
        }
        if (!padding) {
          TestLowLevelAPI(cipher, op, in_place, chunk_size, key, iv, plaintext,
                          ciphertext);
        }
      }
    }
  }
}